

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::transferAccessChainSwizzle(Builder *this,bool dynamic)

{
  size_type sVar1;
  reference pvVar2;
  Id local_18;
  byte local_11;
  Builder *pBStack_10;
  bool dynamic_local;
  Builder *this_local;
  
  local_11 = dynamic;
  pBStack_10 = this;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&(this->accessChain).swizzle);
  if (((sVar1 != 0) || ((this->accessChain).component != 0)) &&
     (sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&(this->accessChain).swizzle), sVar1 < 2)) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&(this->accessChain).swizzle);
    if (sVar1 == 1) {
      if ((this->accessChain).component != 0) {
        __assert_fail("accessChain.component == NoResult",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0x10f2,"void spv::Builder::transferAccessChainSwizzle(bool)");
      }
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                         (&(this->accessChain).swizzle);
      local_18 = makeUintConstant(this,*pvVar2,false);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&(this->accessChain).indexChain,&local_18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&(this->accessChain).swizzle);
      (this->accessChain).preSwizzleBaseType = 0;
    }
    else if (((local_11 & 1) != 0) && ((this->accessChain).component != 0)) {
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&(this->accessChain).swizzle);
      if (sVar1 != 0) {
        __assert_fail("accessChain.swizzle.size() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0x10f8,"void spv::Builder::transferAccessChainSwizzle(bool)");
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&(this->accessChain).indexChain,&(this->accessChain).component);
      (this->accessChain).preSwizzleBaseType = 0;
      (this->accessChain).component = 0;
    }
  }
  return;
}

Assistant:

void Builder::transferAccessChainSwizzle(bool dynamic)
{
    // non existent?
    if (accessChain.swizzle.size() == 0 && accessChain.component == NoResult)
        return;

    // too complex?
    // (this requires either a swizzle, or generating code for a dynamic component)
    if (accessChain.swizzle.size() > 1)
        return;

    // single component, either in the swizzle and/or dynamic component
    if (accessChain.swizzle.size() == 1) {
        assert(accessChain.component == NoResult);
        // handle static component selection
        accessChain.indexChain.push_back(makeUintConstant(accessChain.swizzle.front()));
        accessChain.swizzle.clear();
        accessChain.preSwizzleBaseType = NoType;
    } else if (dynamic && accessChain.component != NoResult) {
        assert(accessChain.swizzle.size() == 0);
        // handle dynamic component
        accessChain.indexChain.push_back(accessChain.component);
        accessChain.preSwizzleBaseType = NoType;
        accessChain.component = NoResult;
    }
}